

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QLatin1StringView data,bool number)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  qsizetype qVar4;
  char *pcVar5;
  byte in_CL;
  char *in_RDX;
  qsizetype in_RSI;
  QTextStreamPrivate *in_RDI;
  long in_FS_OFFSET;
  QChar sign;
  PaddingResult pad;
  QString *in_stack_ffffffffffffff28;
  QChar *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff3e;
  byte bVar6;
  QLatin1Char in_stack_ffffffffffffff3f;
  QLatin1String local_70 [4];
  QLatin1Char local_2b;
  QChar local_2a;
  PaddingResult local_28;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (in_RDI->params).fieldWidth;
  local_18.m_size = in_RSI;
  local_18.m_data = in_RDX;
  sVar3 = QLatin1String::size(&local_18);
  if ((long)sVar3 < (long)iVar1) {
    local_28.right = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.left = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    qVar4 = QLatin1String::size(&local_18);
    local_28 = padding(in_RDI,qVar4);
    sVar3 = local_28.left;
    if (((in_RDI->params).fieldAlignment == AlignAccountingStyle) && ((in_CL & 1) != 0)) {
      local_2a.ucs = L'ꪪ';
      qVar4 = QLatin1String::size(&local_18);
      if (qVar4 < 1) {
        QChar::QChar(&local_2a);
        bVar6 = in_stack_ffffffffffffff3e;
      }
      else {
        pcVar5 = QLatin1String::data(&local_18);
        QLatin1Char::QLatin1Char(&local_2b,*pcVar5);
        QChar::QChar<QLatin1Char,_true>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff3f);
        bVar6 = in_stack_ffffffffffffff3e;
      }
      QLocale::negativeSign
                ((QLocale *)
                 CONCAT17(in_stack_ffffffffffffff3f.ch,CONCAT16(bVar6,in_stack_ffffffffffffff38)));
      bVar2 = ::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      sVar3 = CONCAT71((int7)(sVar3 >> 8),bVar2);
      in_stack_ffffffffffffff3e = 1;
      in_stack_ffffffffffffff3f.ch = in_stack_ffffffffffffff3e;
      if (!bVar2) {
        QLocale::positiveSign((QLocale *)CONCAT17(1,CONCAT16(bVar6,in_stack_ffffffffffffff38)));
        in_stack_ffffffffffffff3e =
             ::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff3f.ch = in_stack_ffffffffffffff3e;
        QString::~QString((QString *)0x4a71d0);
      }
      QString::~QString((QString *)0x4a71dd);
      if ((in_stack_ffffffffffffff3e & 1) != 0) {
        write(in_RDI,(int)&local_2a,(void *)0x1,sVar3);
        pcVar5 = QLatin1String::data(&local_18);
        pcVar5 = pcVar5 + 1;
        qVar4 = QLatin1String::size(&local_18);
        QLatin1String::QLatin1String(local_70,pcVar5,qVar4 + -1);
        local_18.m_size = local_70[0].m_size;
        local_18.m_data = local_70[0].m_data;
      }
    }
    writePadding(in_RDI,CONCAT17(in_stack_ffffffffffffff3f.ch,
                                 CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
    write(in_RDI,(int)local_18.m_size,local_18.m_data,sVar3);
    writePadding(in_RDI,CONCAT17(in_stack_ffffffffffffff3f.ch,
                                 CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  }
  else {
    write(in_RDI,(int)local_18.m_size,local_18.m_data,sVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QLatin1StringView data, bool number)
{
    if (Q_UNLIKELY(params.fieldWidth > data.size())) {

        // handle padding

        const PaddingResult pad = padding(data.size());

        if (params.fieldAlignment == QTextStream::AlignAccountingStyle && number) {
            const QChar sign = data.size() > 0 ? QLatin1Char(*data.data()) : QChar();
            if (sign == locale.negativeSign() || sign == locale.positiveSign()) {
                // write the sign before the padding, then skip it later
                write(&sign, 1);
                data = QLatin1StringView(data.data() + 1, data.size() - 1);
            }
        }

        writePadding(pad.left);
        write(data);
        writePadding(pad.right);
    } else {
        write(data);
    }
}